

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer.cpp
# Opt level: O0

Layer * ncnn::create_layer_naive(int index)

{
  int in_EDI;
  Layer *layer;
  layer_creator_func layer_creator;
  Layer *local_8;
  
  if ((in_EDI < 0) || (0x6a < in_EDI)) {
    local_8 = (Layer *)0x0;
  }
  else if (*(code **)(layer_registry + (long)in_EDI * 0x10 + 8) == (code *)0x0) {
    local_8 = (Layer *)0x0;
  }
  else {
    local_8 = (Layer *)(**(code **)(layer_registry + (long)in_EDI * 0x10 + 8))(0);
    local_8->typeindex = in_EDI;
  }
  return local_8;
}

Assistant:

Layer* create_layer_naive(int index)
{
    if (index < 0 || index >= layer_registry_entry_count)
        return 0;

    layer_creator_func layer_creator = layer_registry[index].creator;
    if (!layer_creator)
        return 0;

    Layer* layer = layer_creator(0);
    layer->typeindex = index;
    return layer;
}